

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O2

mstate init_user_mstate(char *tbase,size_t tsize)

{
  mstate m;
  flag_t fVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(-(int)tbase - 0x10U & 0xf);
  m = (mstate)(tbase + uVar2 + 0x10);
  memset(m,0,0x3b0);
  m[-1].exts = 0x3b3;
  m->least_addr = tbase;
  (m->seg).base = tbase;
  m->max_footprint = tsize;
  m->footprint = tsize;
  (m->seg).size = tsize;
  m->magic = mparams.magic;
  m->release_checks = 0xfff;
  fVar1 = mparams.default_mflags;
  m->extp = (void *)0x0;
  m->exts = 0;
  m->mflags = fVar1 | 4;
  init_bins(m);
  init_top(m,(mchunkptr)(tbase + (m[-1].exts & 0xfffffffffffffff8) + uVar2),
           (size_t)(tbase + (tsize - (long)(tbase + (m[-1].exts & 0xfffffffffffffff8) + uVar2)) +
                            -0x50));
  return m;
}

Assistant:

static mstate init_user_mstate(char* tbase, size_t tsize) {
  size_t msize = pad_request(sizeof(struct malloc_state));
  mchunkptr mn;
  mchunkptr msp = align_as_chunk(tbase);
  mstate m = (mstate)(chunk2mem(msp));
  memset(m, 0, msize);
  (void)INITIAL_LOCK(&m->mutex);
  msp->head = (msize|INUSE_BITS);
  m->seg.base = m->least_addr = tbase;
  m->seg.size = m->footprint = m->max_footprint = tsize;
  m->magic = mparams.magic;
  m->release_checks = MAX_RELEASE_CHECK_RATE;
  m->mflags = mparams.default_mflags;
  m->extp = 0;
  m->exts = 0;
  disable_contiguous(m);
  init_bins(m);
  mn = next_chunk(mem2chunk(m));
  init_top(m, mn, (size_t)((tbase + tsize) - (char*)mn) - TOP_FOOT_SIZE);
  check_top_chunk(m, m->top);
  return m;
}